

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

bool __thiscall wasm::WATParser::anon_unknown_10::LexCtx::canFinish(LexCtx *this)

{
  size_t sVar1;
  char *in_RCX;
  undefined1 uVar2;
  string_view sVar3;
  string_view in;
  string_view in_00;
  string_view in_01;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> local_68;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> local_50;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> local_38;
  
  uVar2 = 1;
  if ((this->input)._M_len != this->lexedSize) {
    sVar3 = next(this);
    in._M_len = sVar3._M_str;
    in._M_str = in_RCX;
    lparen(&local_68,(anon_unknown_10 *)sVar3._M_len,in);
    if (local_68.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
        ._M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_engaged == false) {
      sVar3 = next(this);
      in_00._M_len = sVar3._M_str;
      in_00._M_str = in_RCX;
      rparen(&local_50,(anon_unknown_10 *)sVar3._M_len,in_00);
      if (local_50.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_engaged == false) {
        sVar3 = next(this);
        in_01._M_len = sVar3._M_str;
        in_01._M_str = in_RCX;
        spacechar(&local_38,(anon_unknown_10 *)sVar3._M_len,in_01);
        if (local_38.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
            _M_engaged == false) {
          sVar3._M_str = ";;";
          sVar3._M_len = 2;
          sVar1 = startsWith(this,sVar3);
          uVar2 = (undefined1)sVar1;
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

bool LexCtx::canFinish() const {
  // Logically we want to check for eof, parens, and space. But we don't
  // actually want to parse more than a couple characters of space, so check for
  // individual space chars or comment starts instead.
  return empty() || lparen(next()) || rparen(next()) || spacechar(next()) ||
         startsWith(";;"sv);
}